

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Vdbe * sqlite3VdbeCreate(Parse *pParse)

{
  Parse *in_RDI;
  Vdbe *p;
  sqlite3 *db;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  sqlite3 *db_00;
  Vdbe *local_8;
  
  db_00 = in_RDI->db;
  local_8 = (Vdbe *)sqlite3DbMallocRawNN(db_00,0xaaaaaaaaaaaaaaaa);
  if (local_8 == (Vdbe *)0x0) {
    local_8 = (Vdbe *)0x0;
  }
  else {
    memset(&local_8->aOp,0,0xa8);
    local_8->db = db_00;
    if (db_00->pVdbe != (Vdbe *)0x0) {
      db_00->pVdbe->ppVPrev = &local_8->pVNext;
    }
    local_8->pVNext = db_00->pVdbe;
    local_8->ppVPrev = &db_00->pVdbe;
    db_00->pVdbe = local_8;
    local_8->pParse = in_RDI;
    in_RDI->pVdbe = local_8;
    sqlite3VdbeAddOp2(local_8,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,0);
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE Vdbe *sqlite3VdbeCreate(Parse *pParse){
  sqlite3 *db = pParse->db;
  Vdbe *p;
  p = sqlite3DbMallocRawNN(db, sizeof(Vdbe) );
  if( p==0 ) return 0;
  memset(&p->aOp, 0, sizeof(Vdbe)-offsetof(Vdbe,aOp));
  p->db = db;
  if( db->pVdbe ){
    db->pVdbe->ppVPrev = &p->pVNext;
  }
  p->pVNext = db->pVdbe;
  p->ppVPrev = &db->pVdbe;
  db->pVdbe = p;
  assert( p->eVdbeState==VDBE_INIT_STATE );
  p->pParse = pParse;
  pParse->pVdbe = p;
  assert( pParse->aLabel==0 );
  assert( pParse->nLabel==0 );
  assert( p->nOpAlloc==0 );
  assert( pParse->szOpAlloc==0 );
  sqlite3VdbeAddOp2(p, OP_Init, 0, 1);
  return p;
}